

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::TimingControl*>::emplace_back<slang::ast::TimingControl*>
          (SmallVectorBase<slang::ast::TimingControl*> *this,TimingControl **args)

{
  iterator ppTVar1;
  TimingControl **args_local;
  SmallVectorBase<slang::ast::TimingControl_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppTVar1 = SmallVectorBase<slang::ast::TimingControl_*>::end
                        ((SmallVectorBase<slang::ast::TimingControl_*> *)this);
    this_local = (SmallVectorBase<slang::ast::TimingControl_*> *)
                 emplaceRealloc<slang::ast::TimingControl*>(this,ppTVar1,args);
  }
  else {
    ppTVar1 = SmallVectorBase<slang::ast::TimingControl_*>::end
                        ((SmallVectorBase<slang::ast::TimingControl_*> *)this);
    *ppTVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::ast::TimingControl_*> *)
                 SmallVectorBase<slang::ast::TimingControl_*>::back
                           ((SmallVectorBase<slang::ast::TimingControl_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }